

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_allocators.h
# Opt level: O3

void __thiscall
density_tests::UnmovableFastTestAllocator<65536UL>::deallocate
          (UnmovableFastTestAllocator<65536UL> *this,void *i_block,size_t i_size,size_t i_alignment,
          size_t i_alignment_offset)

{
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  ulong uVar3;
  
  density::basic_default_allocator<65536UL>::deallocate
            ((basic_default_allocator<65536UL> *)this,i_block,i_size,i_alignment,i_alignment_offset)
  ;
  LOCK();
  paVar1 = &this->m_living_allocations;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  LOCK();
  paVar1 = &this->m_living_bytes;
  uVar3 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i - i_size;
  UNLOCK();
  if (_Var2 == 0 || uVar3 < i_size) {
    detail::assert_failed<>
              ("prev_living_allocations >= 1 && prev_living_bytes >= i_size",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/test_allocators.h"
               ,0x15e);
  }
  return;
}

Assistant:

void deallocate(
          void * i_block, size_t i_size, size_t i_alignment, size_t i_alignment_offset = 0) noexcept
        {
            Base::deallocate(i_block, i_size, i_alignment, i_alignment_offset);

            auto const prev_living_allocations =
              m_living_allocations.fetch_sub(1, std::memory_order_relaxed);
            auto const prev_living_bytes =
              m_living_bytes.fetch_sub(i_size, std::memory_order_relaxed);
            DENSITY_TEST_ASSERT(prev_living_allocations >= 1 && prev_living_bytes >= i_size);
        }